

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_macd.c
# Opt level: O3

ErrorNumber test_func_macd(TA_History *history)

{
  TA_TestId TVar1;
  TA_RetCode TVar2;
  ErrorNumber EVar3;
  TA_Test_conflict7 *pTVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint local_50;
  uint local_4c;
  ulong local_48;
  TA_Test_conflict7 *local_40;
  TA_Real *local_38;
  
  pTVar4 = tableTest;
  uVar5 = 0;
  while( true ) {
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("TA_MACD Failed Bad Parameter for Test #%d (%d,%d)\n",uVar5 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    TVar2 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,0);
    if (TVar2 != TA_SUCCESS) {
      uVar7 = 0x8a;
      goto LAB_00117469;
    }
    TA_SetCompatibility(pTVar4->compatibility);
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    setInputBuffer(2,history->close,history->nbBars);
    setInputBuffer(3,history->close,history->nbBars);
    local_4c = 0;
    local_50 = 0;
    TVar1 = pTVar4->testId;
    if (TVar1 == TA_ANY_MA_TEST) {
      TVar2 = TA_MACD(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInFastPeriod,
                      pTVar4->optInSlowPeriod,pTVar4->optInSignalPeriod_2,(int *)&local_4c,
                      (int *)&local_50,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
    }
    else if (TVar1 == TA_ADOSC_3_10_TEST) {
      TVar2 = TA_MACDEXT(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInFastPeriod,
                         TA_MAType_EMA,pTVar4->optInSlowPeriod,TA_MAType_EMA,
                         pTVar4->optInSignalPeriod_2,TA_MAType_EMA,(int *)&local_4c,(int *)&local_50
                         ,gBuffer[0].out0,gBuffer[0].out1,gBuffer[0].out2);
    }
    else {
      TVar2 = 0x1407;
      if (TVar1 == TA_AD_TEST) {
        TVar2 = TA_MACDFIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInSignalPeriod_2
                           ,(int *)&local_4c,(int *)&local_50,gBuffer[0].out0,gBuffer[0].out1,
                           gBuffer[0].out2);
      }
    }
    EVar3 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar3 != TA_TEST_PASS) {
      uVar7 = (ulong)EVar3;
      goto LAB_00117469;
    }
    local_48 = uVar5;
    EVar3 = checkExpectedValue(gBuffer[0].out0,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    uVar6 = 0;
    if (EVar3 != TA_TEST_PASS) break;
    EVar3 = checkExpectedValue(gBuffer[0].out1,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal1,
                               pTVar4->oneOfTheExpectedOutRealIndex1);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011743a:
      uVar7 = (ulong)EVar3;
      uVar6 = 1;
      goto LAB_0011744e;
    }
    EVar3 = checkExpectedValue(gBuffer[0].out2,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal2,
                               pTVar4->oneOfTheExpectedOutRealIndex2);
    if (EVar3 != TA_TEST_PASS) {
LAB_00117445:
      uVar7 = (ulong)EVar3;
      uVar6 = 2;
      goto LAB_0011744e;
    }
    local_50 = 0;
    local_4c = 0;
    TVar1 = pTVar4->testId;
    if (TVar1 == TA_ANY_MA_TEST) {
      TVar2 = TA_MACD(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInFastPeriod,
                      pTVar4->optInSlowPeriod,pTVar4->optInSignalPeriod_2,(int *)&local_4c,
                      (int *)&local_50,gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
    }
    else if (TVar1 == TA_ADOSC_3_10_TEST) {
      TVar2 = TA_MACDEXT(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInFastPeriod,
                         TA_MAType_EMA,pTVar4->optInSlowPeriod,TA_MAType_EMA,
                         pTVar4->optInSignalPeriod_2,TA_MAType_EMA,(int *)&local_4c,(int *)&local_50
                         ,gBuffer[1].in,gBuffer[1].out1,gBuffer[1].out2);
    }
    else if (TVar1 == TA_AD_TEST) {
      TVar2 = TA_MACDFIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInSignalPeriod_2,
                         (int *)&local_4c,(int *)&local_50,gBuffer[1].in,gBuffer[1].out1,
                         gBuffer[1].out2);
    }
    EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar3 != TA_TEST_PASS) {
LAB_00117461:
      uVar7 = (ulong)EVar3;
      uVar5 = local_48;
      goto LAB_00117469;
    }
    EVar3 = checkExpectedValue(gBuffer[1].in,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) break;
    EVar3 = checkExpectedValue(gBuffer[1].out1,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal1,
                               pTVar4->oneOfTheExpectedOutRealIndex1);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011743a;
    EVar3 = checkExpectedValue(gBuffer[1].out2,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal2,
                               pTVar4->oneOfTheExpectedOutRealIndex2);
    if (EVar3 != TA_TEST_PASS) goto LAB_00117445;
    local_4c = 0;
    local_50 = 0;
    TVar1 = pTVar4->testId;
    if (TVar1 == TA_ANY_MA_TEST) {
      TVar2 = TA_MACD(pTVar4->startIdx,pTVar4->endIdx,gBuffer[2].in,pTVar4->optInFastPeriod,
                      pTVar4->optInSlowPeriod,pTVar4->optInSignalPeriod_2,(int *)&local_4c,
                      (int *)&local_50,gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
    }
    else if (TVar1 == TA_ADOSC_3_10_TEST) {
      TVar2 = TA_MACDEXT(pTVar4->startIdx,pTVar4->endIdx,gBuffer[2].in,pTVar4->optInFastPeriod,
                         TA_MAType_EMA,pTVar4->optInSlowPeriod,TA_MAType_EMA,
                         pTVar4->optInSignalPeriod_2,TA_MAType_EMA,(int *)&local_4c,(int *)&local_50
                         ,gBuffer[2].out1,gBuffer[2].in,gBuffer[2].out2);
    }
    else {
      TVar2 = 0x1407;
      if (TVar1 == TA_AD_TEST) {
        TVar2 = TA_MACDFIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[2].in,pTVar4->optInSignalPeriod_2
                           ,(int *)&local_4c,(int *)&local_50,gBuffer[2].out1,gBuffer[2].in,
                           gBuffer[2].out2);
      }
    }
    EVar3 = checkSameContent(gBuffer[1].out1,gBuffer[2].in);
    if (EVar3 != TA_TEST_PASS) goto LAB_00117461;
    EVar3 = checkExpectedValue(gBuffer[2].out1,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) break;
    EVar3 = checkExpectedValue(gBuffer[2].in,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal1,
                               pTVar4->oneOfTheExpectedOutRealIndex1);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011743a;
    EVar3 = checkExpectedValue(gBuffer[2].out2,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal2,
                               pTVar4->oneOfTheExpectedOutRealIndex2);
    if (EVar3 != TA_TEST_PASS) goto LAB_00117445;
    local_4c = 0;
    local_50 = 0;
    TVar1 = pTVar4->testId;
    if (TVar1 == TA_ANY_MA_TEST) {
      TVar2 = TA_MACD(pTVar4->startIdx,pTVar4->endIdx,gBuffer[3].in,pTVar4->optInFastPeriod,
                      pTVar4->optInSlowPeriod,pTVar4->optInSignalPeriod_2,(int *)&local_4c,
                      (int *)&local_50,gBuffer[3].out1,gBuffer[3].out2,gBuffer[3].in);
    }
    else if (TVar1 == TA_ADOSC_3_10_TEST) {
      TVar2 = TA_MACDEXT(pTVar4->startIdx,pTVar4->endIdx,gBuffer[3].in,pTVar4->optInFastPeriod,
                         TA_MAType_EMA,pTVar4->optInSlowPeriod,TA_MAType_EMA,
                         pTVar4->optInSignalPeriod_2,TA_MAType_EMA,(int *)&local_4c,(int *)&local_50
                         ,gBuffer[3].out1,gBuffer[3].out2,gBuffer[3].in);
    }
    else {
      TVar2 = 0x1407;
      if (TVar1 == TA_AD_TEST) {
        TVar2 = TA_MACDFIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[3].in,pTVar4->optInSignalPeriod_2
                           ,(int *)&local_4c,(int *)&local_50,gBuffer[3].out1,gBuffer[3].out2,
                           gBuffer[3].in);
      }
    }
    EVar3 = checkSameContent(gBuffer[2].out2,gBuffer[3].in);
    if (EVar3 != TA_TEST_PASS) goto LAB_00117461;
    EVar3 = checkExpectedValue(gBuffer[3].out1,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal0,
                               pTVar4->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) break;
    EVar3 = checkExpectedValue(gBuffer[3].out2,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal1,
                               pTVar4->oneOfTheExpectedOutRealIndex1);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011743a;
    EVar3 = checkExpectedValue(gBuffer[3].in,TVar2,pTVar4->expectedRetCode,local_4c,
                               pTVar4->expectedBegIdx,local_50,pTVar4->expectedNbElement,
                               pTVar4->oneOfTheExpectedOutReal2,
                               pTVar4->oneOfTheExpectedOutRealIndex2);
    if (EVar3 != TA_TEST_PASS) goto LAB_00117445;
    local_38 = history->close;
    local_40 = pTVar4;
    if ((pTVar4->doRangeTestFlag != 0) &&
       (EVar3 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_EMA,&local_40,3,0), EVar3 != TA_TEST_PASS
       )) goto LAB_00117461;
    uVar5 = local_48 + 1;
    pTVar4 = pTVar4 + 1;
    if (uVar5 == 6) {
      return TA_TEST_PASS;
    }
  }
  uVar7 = (ulong)EVar3;
LAB_0011744e:
  printf("Fail for output id=%d\n",uVar6);
  uVar5 = local_48;
LAB_00117469:
  printf("TA_MACD Failed Test #%d (Code=%d)\n",uVar5 & 0xffffffff,uVar7);
  return (ErrorNumber)uVar7;
}

Assistant:

ErrorNumber test_func_macd( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   for( i=0; i < NB_TEST; i++ )
   {

      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "TA_MACD Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i,
                 tableTest[i].expectedNbElement,
                 history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "TA_MACD Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* All test succeed. */
   return TA_TEST_PASS;
}